

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

void __thiscall libtorrent::aux::peer_connection::keep_alive(peer_connection *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  time_point tVar4;
  
  tVar4 = time_now();
  iVar3 = (this->m_last_sent).m_time_diff.__r;
  lVar1 = (this->m_connect).__d.__r;
  iVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x33])(this);
  if (((long)(iVar2 / 2) <= (((long)tVar4.__d.__r - lVar1) + (long)iVar3 * -1000000) / 1000000000)
     && (((this->super_peer_connection_hot_members).field_0x28 & 2) == 0)) {
    iVar3 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])(this);
    if (((char)iVar3 == '\0') &&
       (((this->m_channel_state).
         super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
         ._M_elems[0].m_val & 4) == 0)) {
      peer_log(this,outgoing_message,"KEEPALIVE","");
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x27])(this);
      return;
    }
  }
  return;
}

Assistant:

void peer_connection::keep_alive()
	{
		TORRENT_ASSERT(is_single_thread());
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

		time_duration const d = aux::time_now() - m_last_sent.get(m_connect);
		if (total_seconds(d) < timeout() / 2) return;

		if (m_connecting) return;
		if (in_handshake()) return;

		// if the last send has not completed yet, do not send a keep
		// alive
		if (m_channel_state[upload_channel] & peer_info::bw_network) return;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::outgoing_message, "KEEPALIVE");
#endif

		write_keepalive();
	}